

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O1

Test * SubprocessTestInterruptParent::Create(void)

{
  Test *pTVar1;
  
  pTVar1 = (Test *)operator_new(0x2d8);
  pTVar1->failed_ = false;
  pTVar1->assertion_failures_ = 0;
  pTVar1->_vptr_Test = (_func_int **)&PTR__SubprocessTest_001fd178;
  SubprocessSet::SubprocessSet((SubprocessSet *)(pTVar1 + 1));
  *(undefined ***)&pTVar1[0x2c].failed_ = &PTR__TokenPool_001fd1b0;
  pTVar1->_vptr_Test = (_func_int **)&PTR__SubprocessTest_001fce08;
  g_current_test = pTVar1;
  return pTVar1;
}

Assistant:

TEST_F(SubprocessTest, InterruptParent) {
  Subprocess* subproc = subprocs_.Add("kill -INT $PPID ; sleep 1");
  ASSERT_NE((Subprocess *) 0, subproc);

  while (!subproc->Done()) {
    bool interrupted = subprocs_.DoWork(NULL);
    if (interrupted)
      return;
  }

  ASSERT_FALSE("We should have been interrupted");
}